

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layout.c++
# Opt level: O0

ListBuilder *
capnp::_::WireHelpers::initListPointer
          (ListBuilder *__return_storage_ptr__,WirePointer *ref,SegmentBuilder *segment,
          CapTableBuilder *capTable,ElementCount elementCount,ElementSize elementSize,
          BuilderArena *orphanArena)

{
  bool bVar1;
  BitsPerElementTableType structDataSize;
  unsigned_long uVar2;
  WordCount64 WVar3;
  word *ptr_00;
  word *ptr;
  WordCount64 wordCount;
  Fault f_1;
  BitsPerElementTableType local_b0;
  DebugExpression<unsigned_int> local_ac;
  undefined1 local_a8 [8];
  DebugComparison<unsigned_int,_unsigned_int> _kjCondition_1;
  BitsPerElementTableType step;
  uint pointerCount;
  uint dataSize;
  uint checkedElementCount;
  Fault local_68;
  Fault f;
  ElementSize *local_58;
  undefined1 local_50 [8];
  DebugComparison<capnp::ElementSize_&,_capnp::ElementSize> _kjCondition;
  ElementSize elementSize_local;
  ElementCount elementCount_local;
  CapTableBuilder *capTable_local;
  SegmentBuilder *segment_local;
  WirePointer *ref_local;
  
  _kjCondition._35_1_ = elementSize;
  _kjCondition._36_4_ = elementCount;
  capTable_local = (CapTableBuilder *)segment;
  segment_local = (SegmentBuilder *)ref;
  local_58 = (ElementSize *)
             kj::_::DebugExpressionStart::operator<<
                       ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&_kjCondition.field_0x23);
  f.exception._7_1_ = 7;
  kj::_::DebugExpression<capnp::ElementSize&>::operator!=
            ((DebugComparison<capnp::ElementSize_&,_capnp::ElementSize> *)local_50,
             (DebugExpression<capnp::ElementSize&> *)&local_58,
             (ElementSize *)((long)&f.exception + 7));
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_50);
  if (!bVar1) {
    kj::_::Debug::Fault::
    Fault<kj::Exception::Type,kj::_::DebugComparison<capnp::ElementSize&,capnp::ElementSize>&,char_const(&)[52]>
              (&local_68,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/layout.c++"
               ,0x4af,FAILED,"elementSize != ElementSize::INLINE_COMPOSITE",
               "_kjCondition,\"Should have called initStructListPointer() instead.\"",
               (DebugComparison<capnp::ElementSize_&,_capnp::ElementSize> *)local_50,
               (char (*) [52])"Should have called initStructListPointer() instead.");
    kj::_::Debug::Fault::fatal(&local_68);
  }
  dataSize = assertMaxBits<29u,unsigned_int,capnp::_::WireHelpers::initListPointer(capnp::_::WirePointer*,capnp::_::SegmentBuilder*,capnp::_::CapTableBuilder*,unsigned_int,capnp::ElementSize,capnp::_::BuilderArena*)::_lambda()_1_>
                       (_kjCondition._36_4_,(anon_class_1_0_00000001 *)((long)&pointerCount + 3));
  structDataSize = dataBitsPerElement(_kjCondition._35_1_);
  _kjCondition_1._28_4_ = pointersPerElement(_kjCondition._35_1_);
  local_b0 = bitsPerElementIncludingPointers(_kjCondition._35_1_);
  _kjCondition_1._24_4_ = local_b0;
  local_ac = kj::_::DebugExpressionStart::operator<<
                       ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_b0);
  f_1.exception._4_4_ = structDataSize + _kjCondition_1._28_4_ * 0x40;
  kj::_::DebugExpression<unsigned_int>::operator==
            ((DebugComparison<unsigned_int,_unsigned_int> *)local_a8,&local_ac,
             (uint *)((long)&f_1.exception + 4));
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_a8);
  if (!bVar1) {
    kj::_::Debug::Fault::
    Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_int,unsigned_int>&>
              ((Fault *)&wordCount,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/layout.c++"
               ,0x4b7,FAILED,"step * ELEMENTS == (dataSize + pointerCount * BITS_PER_POINTER)",
               "_kjCondition,",(DebugComparison<unsigned_int,_unsigned_int> *)local_a8);
    kj::_::Debug::Fault::fatal((Fault *)&wordCount);
  }
  uVar2 = upgradeBound<unsigned_long,unsigned_int>(dataSize);
  WVar3 = roundBitsUpToWords(uVar2 * (uint)_kjCondition_1._24_4_);
  ptr_00 = allocate((WirePointer **)&segment_local,(SegmentBuilder **)&capTable_local,capTable,
                    (SegmentWordCount)WVar3,LIST,orphanArena);
  WirePointer::ListRef::set
            ((ListRef *)((long)&(segment_local->super_SegmentReader).arena + 4),_kjCondition._35_1_,
             dataSize);
  ListBuilder::ListBuilder
            (__return_storage_ptr__,(SegmentBuilder *)capTable_local,capTable,ptr_00,
             _kjCondition_1._24_4_,dataSize,structDataSize,_kjCondition_1._28_2_,_kjCondition._35_1_
            );
  return __return_storage_ptr__;
}

Assistant:

static KJ_ALWAYS_INLINE(ListBuilder initListPointer(
      WirePointer* ref, SegmentBuilder* segment, CapTableBuilder* capTable,
      ElementCount elementCount, ElementSize elementSize, BuilderArena* orphanArena = nullptr)) {
    KJ_DREQUIRE(elementSize != ElementSize::INLINE_COMPOSITE,
        "Should have called initStructListPointer() instead.");

    auto checkedElementCount = assertMaxBits<LIST_ELEMENT_COUNT_BITS>(elementCount,
        []() { KJ_FAIL_REQUIRE("tried to allocate list with too many elements"); });

    auto dataSize = dataBitsPerElement(elementSize) * ELEMENTS;
    auto pointerCount = pointersPerElement(elementSize) * ELEMENTS;
    auto step = bitsPerElementIncludingPointers(elementSize);
    KJ_DASSERT(step * ELEMENTS == (dataSize + pointerCount * BITS_PER_POINTER));

    // Calculate size of the list.
    auto wordCount = roundBitsUpToWords(upgradeBound<uint64_t>(checkedElementCount) * step);

    // Allocate the list.
    word* ptr = allocate(ref, segment, capTable, wordCount, WirePointer::LIST, orphanArena);

    // Initialize the pointer.
    ref->listRef.set(elementSize, checkedElementCount);

    // Build the ListBuilder.
    return ListBuilder(segment, capTable, ptr, step, checkedElementCount,
                       dataSize, pointerCount, elementSize);
  }